

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void constructAutomaticIndex(Parse *pParse,WhereClause *pWC,Bitmask notReady,WhereLevel *pLevel)

{
  byte *pbVar1;
  undefined1 *puVar2;
  SrcItem *pSrc;
  u8 uVar3;
  short sVar4;
  Vdbe *p;
  SrcList *pSrcList;
  Table *pTVar5;
  WhereLoop *p_00;
  Subquery *pSVar6;
  bool bVar7;
  char cVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int p3;
  Expr *pEVar13;
  Index *pIdx;
  CollSeq *pCVar14;
  uint uVar15;
  WhereTerm *pWVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  long lVar20;
  Op *pOVar21;
  int regOut;
  uint uVar22;
  u16 *puVar23;
  int iVar24;
  ulong uVar25;
  WhereTerm *pWVar26;
  long in_FS_OFFSET;
  bool bVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar35;
  ulong uVar34;
  uint uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  uint uVar41;
  uint uVar43;
  uint uVar44;
  undefined1 auVar42 [16];
  uint uVar45;
  undefined1 auVar46 [16];
  ulong uVar47;
  ulong uVar48;
  Expr *local_b0;
  long local_78;
  char *zNotUsed;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  zNotUsed = &DAT_aaaaaaaaaaaaaaaa;
  p = pParse->pVdbe;
  iVar10 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
  pWVar26 = pWC->a;
  pSrcList = pWC->pWInfo->pTabList;
  pSrc = pSrcList->a + pLevel->iFrom;
  pTVar5 = pSrc->pSTab;
  pWVar16 = pWVar26 + pWC->nTerm;
  p_00 = pLevel->pWLoop;
  if ((long)pWC->nTerm < 1) {
    uVar29 = 0;
    uVar18 = 0;
    local_b0 = (Expr *)0x0;
  }
  else {
    uVar29 = 0;
    local_b0 = (Expr *)0x0;
    bVar7 = false;
    uVar18 = 0;
    do {
      if ((pWVar26->wtFlags & 2) == 0) {
        pEVar13 = pWVar26->pExpr;
        iVar11 = sqlite3ExprIsSingleTableConstraint(pEVar13,pSrcList,(uint)pLevel->iFrom,0);
        if (iVar11 != 0) {
          if (pEVar13 == (Expr *)0x0) {
            pEVar13 = (Expr *)0x0;
          }
          else {
            pEVar13 = exprDup(pParse->db,pEVar13,0,(EdupBuf *)0x0);
          }
          local_b0 = sqlite3ExprAnd(pParse,local_b0,pEVar13);
        }
      }
      iVar11 = termCanDriveIndex(pWVar26,pSrc,notReady);
      if (iVar11 == 0) {
LAB_0019524d:
        bVar27 = true;
      }
      else {
        iVar11 = (pWVar26->u).x.leftColumn;
        uVar25 = 1L << ((byte)iVar11 & 0x3f);
        if (0x3f < iVar11) {
          uVar25 = 0x8000000000000000;
        }
        if (!bVar7) {
          sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar5->zName);
        }
        bVar7 = true;
        if ((uVar25 & uVar18) != 0) goto LAB_0019524d;
        iVar11 = whereLoopResize(pParse->db,p_00,uVar29 + 1);
        bVar27 = iVar11 == 0;
        if (bVar27) {
          p_00->aLTerm[(int)uVar29] = pWVar26;
          uVar18 = uVar18 | uVar25;
          uVar29 = uVar29 + 1;
        }
        bVar7 = true;
      }
      if (!bVar27) goto LAB_00195a56;
      pWVar26 = pWVar26 + 1;
    } while (pWVar26 < pWVar16);
  }
  p_00->nLTerm = (u16)uVar29;
  (p_00->u).btree.nEq = (u16)uVar29;
  p_00->wsFlags = 0x4241;
  if (pTVar5->eTabType == '\x02') {
    uVar25 = ~uVar18;
  }
  else {
    uVar25 = (~uVar18 | 0x8000000000000000) & pSrc->colUsed;
  }
  cVar8 = (char)pTVar5->tabFlags;
  if ((cVar8 < '\0') && (0 < (long)pTVar5->nCol)) {
    puVar23 = &pTVar5->aCol->colFlags;
    uVar17 = 0;
    do {
      if ((*puVar23 & 1) != 0) {
        if (0x3e < uVar17) {
          uVar25 = uVar25 | 0x8000000000000000;
          break;
        }
        uVar34 = 1L << ((byte)uVar17 & 0x3f);
        if ((uVar18 >> (uVar17 & 0x3f) & 1) != 0) {
          uVar34 = 0;
        }
        uVar25 = uVar25 | uVar34;
      }
      uVar17 = uVar17 + 1;
      puVar23 = puVar23 + 8;
    } while ((long)pTVar5->nCol != uVar17);
  }
  sVar4 = pTVar5->nCol;
  uVar22 = (uint)sVar4;
  uVar15 = 0x3f;
  if (sVar4 < 0x3f) {
    uVar15 = uVar22;
  }
  if (0 < (int)uVar22) {
    uVar18 = (ulong)(uVar15 + 3 & 0x7c);
    lVar20 = (ulong)uVar15 - 1;
    auVar37._8_4_ = (int)lVar20;
    auVar37._0_8_ = lVar20;
    auVar37._12_4_ = (int)((ulong)lVar20 >> 0x20);
    auVar40._8_4_ = (int)uVar25;
    auVar40._0_8_ = uVar25;
    auVar40._12_4_ = (int)(uVar25 >> 0x20);
    auVar42 = _DAT_00201080;
    auVar46 = _DAT_00201090;
    uVar31 = 0;
    uVar33 = 0;
    uVar36 = 0;
    do {
      uVar35 = uVar36;
      uVar32 = uVar33;
      uVar30 = uVar31;
      uVar28 = uVar29;
      auVar38 = auVar46;
      auVar39 = auVar42;
      uVar47 = 1L << auVar39._0_8_ & uVar25;
      uVar48 = 1L << auVar39._8_8_ & auVar40._8_8_;
      uVar17 = 1L << auVar38._0_8_ & uVar25;
      uVar34 = 1L << auVar38._8_8_ & auVar40._8_8_;
      uVar29 = (uVar28 - ((int)(uVar17 >> 0x20) == 0 && (int)uVar17 == 0)) + 1;
      uVar31 = (uVar30 - ((int)uVar34 == 0 && (int)(uVar34 >> 0x20) == 0)) + 1;
      uVar33 = (uVar32 - ((int)(uVar47 >> 0x20) == 0 && (int)uVar47 == 0)) + 1;
      uVar36 = (uVar35 - ((int)uVar48 == 0 && (int)(uVar48 >> 0x20) == 0)) + 1;
      auVar46._0_8_ = auVar38._0_8_ + 4;
      auVar46._8_8_ = auVar38._8_8_ + 4;
      auVar42._0_8_ = auVar39._0_8_ + 4;
      auVar42._8_8_ = auVar39._8_8_ + 4;
      uVar18 = uVar18 - 4;
    } while (uVar18 != 0);
    auVar37 = auVar37 ^ _DAT_002010a0;
    auVar38 = auVar38 ^ _DAT_002010a0;
    iVar11 = auVar37._4_4_;
    iVar12 = auVar37._12_4_;
    auVar39 = auVar39 ^ _DAT_002010a0;
    uVar41 = -(uint)(iVar11 < auVar38._4_4_ ||
                    auVar38._4_4_ == iVar11 && auVar37._0_4_ < auVar38._0_4_);
    uVar43 = -(uint)(iVar12 < auVar38._12_4_ ||
                    auVar38._12_4_ == iVar12 && auVar37._8_4_ < auVar38._8_4_);
    uVar44 = -(uint)(iVar11 < auVar39._4_4_ ||
                    auVar39._4_4_ == iVar11 && auVar37._0_4_ < auVar39._0_4_);
    uVar45 = -(uint)(iVar12 < auVar39._12_4_ ||
                    auVar39._12_4_ == iVar12 && auVar37._8_4_ < auVar39._8_4_);
    uVar29 = (~uVar45 & uVar36 | uVar35 & uVar45) + (~uVar43 & uVar31 | uVar30 & uVar43) +
             (~uVar44 & uVar33 | uVar32 & uVar44) + (~uVar41 & uVar29 | uVar28 & uVar41);
  }
  iVar11 = ((uint)((long)pSrc->colUsed >> 0x3f) & uVar22 - 0x3f) + uVar29;
  uVar18 = 0;
  pIdx = sqlite3AllocateIndexObject(pParse->db,(ushort)(-1 < cVar8) + (short)iVar11,0,&zNotUsed);
  if (pIdx != (Index *)0x0) {
    (p_00->u).btree.pIndex = pIdx;
    pIdx->zName = "auto-index";
    pIdx->pTable = pTVar5;
    pWVar26 = pWC->a;
    bVar9 = 0;
    if (pWVar26 < pWVar16) {
      bVar9 = 0;
      uVar17 = 0;
      uVar18 = 0;
      do {
        iVar12 = termCanDriveIndex(pWVar26,pSrc,notReady);
        if (iVar12 != 0) {
          iVar12 = (pWVar26->u).x.leftColumn;
          uVar34 = 1L << ((byte)iVar12 & 0x3f);
          if (0x3f < iVar12) {
            uVar34 = 0x8000000000000000;
          }
          if ((uVar34 & uVar17) == 0) {
            pEVar13 = pWVar26->pExpr;
            iVar24 = (int)uVar18;
            pIdx->aiColumn[iVar24] = (i16)iVar12;
            pCVar14 = sqlite3ExprCompareCollSeq(pParse,pEVar13);
            pcVar19 = "BINARY";
            if (pCVar14 != (CollSeq *)0x0) {
              pcVar19 = pCVar14->zName;
            }
            uVar17 = uVar34 | uVar17;
            pIdx->azColl[iVar24] = pcVar19;
            uVar18 = (ulong)(iVar24 + 1);
            pEVar13 = pEVar13->pLeft;
            if ((pEVar13 != (Expr *)0x0) && (cVar8 = sqlite3ExprAffinity(pEVar13), cVar8 != 'B')) {
              bVar9 = 1;
            }
          }
        }
        pWVar26 = pWVar26 + 1;
      } while (pWVar26 < pWVar16);
    }
    if (0 < sVar4) {
      uVar17 = 0;
      do {
        if ((uVar25 >> (uVar17 & 0x3f) & 1) != 0) {
          iVar12 = (int)uVar18;
          pIdx->aiColumn[iVar12] = (i16)uVar17;
          pIdx->azColl[iVar12] = "BINARY";
          uVar18 = (ulong)(iVar12 + 1);
        }
        uVar17 = uVar17 + 1;
      } while (uVar15 != uVar17);
    }
    if (((long)pSrc->colUsed < 0) && (0x3f < pTVar5->nCol)) {
      uVar18 = (ulong)(int)uVar18;
      iVar12 = 0x3f;
      do {
        pIdx->aiColumn[uVar18] = (i16)iVar12;
        pIdx->azColl[uVar18] = "BINARY";
        uVar18 = uVar18 + 1;
        iVar12 = iVar12 + 1;
      } while (iVar12 < pTVar5->nCol);
    }
    iVar12 = (int)uVar18;
    if ((pTVar5->tabFlags & 0x80) == 0) {
      pIdx->aiColumn[iVar12] = -1;
      pIdx->azColl[iVar12] = "BINARY";
    }
    iVar24 = pParse->nTab;
    pParse->nTab = iVar24 + 1;
    pLevel->iIdxCur = iVar24;
    sqlite3VdbeAddOp3(p,0x74,iVar24,iVar11 + 1,0);
    sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
    if ((bool)((pParse->db->dbOptFlags & 0x80000) == 0 & bVar9)) {
      sqlite3WhereExplainBloomFilter(pParse,pWC->pWInfo,pLevel);
      iVar11 = pParse->nMem + 1;
      pParse->nMem = iVar11;
      pLevel->regFilter = iVar11;
      sqlite3VdbeAddOp3(p,0x4d,10000,iVar11,0);
    }
    if (((pSrc->fg).field_0x1 & 0x40) == 0) {
      local_78 = 0;
      iVar11 = sqlite3VdbeAddOp3(p,0x24,pLevel->iTabCur,0,0);
    }
    else {
      pSVar6 = (pSrc->u4).pSubq;
      iVar11 = pSVar6->regReturn;
      iVar24 = sqlite3VdbeAddOp3(p,0x47,0,0,0);
      sqlite3VdbeAddOp3(p,0xb,iVar11,0,pSVar6->addrFillSub);
      iVar11 = sqlite3VdbeAddOp3(p,0xc,iVar11,0,0);
      local_78 = (long)iVar24;
    }
    if (local_b0 == (Expr *)0x0) {
      iVar24 = 0;
    }
    else {
      iVar24 = pParse->nLabel + -1;
      pParse->nLabel = iVar24;
      sqlite3ExprIfFalse(pParse,local_b0,iVar24,0x10);
      pbVar1 = (byte *)((long)&p_00->wsFlags + 2);
      *pbVar1 = *pbVar1 | 2;
    }
    if (pParse->nTempReg == '\0') {
      regOut = pParse->nMem + 1;
      pParse->nMem = regOut;
    }
    else {
      bVar9 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar9;
      regOut = pParse->aTempReg[bVar9];
    }
    p3 = sqlite3GenerateIndexKey(pParse,pIdx,pLevel->iTabCur,regOut,0,(int *)0x0,(Index *)0x0,0);
    if (pLevel->regFilter != 0) {
      sqlite3VdbeAddOp4Int(p,0xb7,pLevel->regFilter,0,p3,(uint)(p_00->u).btree.nEq);
    }
    sqlite3VdbeAddOp3(p,0x8a,pLevel->iIdxCur,regOut,0);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = 0x10;
    }
    if (local_b0 != (Expr *)0x0) {
      sqlite3VdbeResolveLabel(p,iVar24);
    }
    if (((pSrc->fg).field_0x1 & 0x40) == 0) {
      sqlite3VdbeAddOp3(p,0x27,pLevel->iTabCur,iVar11 + 1,0);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 3;
      }
    }
    else {
      if (p->db->mallocFailed == '\0') {
        pOVar21 = p->aOp + local_78;
      }
      else {
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar21->p2 = p3 + iVar12;
      translateColumnToCopy
                (pParse,iVar11,pLevel->iTabCur,((pSrc->u4).pSubq)->regResult,pLevel->iIdxCur);
      sqlite3VdbeAddOp3(p,9,0,iVar11,0);
      puVar2 = &(pSrc->fg).field_0x1;
      *puVar2 = *puVar2 & 0xbf;
    }
    uVar3 = p->db->mallocFailed;
    if (uVar3 == '\0') {
      pOVar21 = p->aOp + iVar11;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p2 = p->nOp;
    if (regOut != 0) {
      bVar9 = pParse->nTempReg;
      if ((ulong)bVar9 < 8) {
        pParse->nTempReg = bVar9 + 1;
        pParse->aTempReg[bVar9] = regOut;
      }
    }
    if (uVar3 == '\0') {
      pOVar21 = p->aOp + iVar10;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p2 = p->nOp;
  }
LAB_00195a56:
  if (local_b0 == (Expr *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sqlite3ExprDeleteNN(pParse->db,local_b0);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  WhereClause *pWC,           /* The WHERE clause */
  const Bitmask notReady,     /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warning has been issued */
  u8 useBloomFilter = 0;      /* True to also add a Bloom filter */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  SrcList *pTabList;          /* The complete FROM clause */
  SrcItem *pSrc;              /* The FROM clause term to get the next index */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  int addrExp = 0;            /* Address of OP_Explain */
#endif

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTabList = pWC->pWInfo->pTabList;
  pSrc = &pTabList->a[pLevel->iFrom];
  pTable = pSrc->pSTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    /* Make the automatic index a partial index if there are terms in the
    ** WHERE clause (or the ON clause of a LEFT join) that constrain which
    ** rows of the target table (pSrc) that can be used. */
    if( (pTerm->wtFlags & TERM_VIRTUAL)==0
     && sqlite3ExprIsSingleTableConstraint(pExpr, pTabList, pLevel->iFrom, 0)
    ){
      pPartial = sqlite3ExprAnd(pParse, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zCnName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 || pParse->db->mallocFailed );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  if( IsView(pTable) ){
    extraCols = ALLBITS & ~idxCols;
  }else{
    extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  }
  if( !HasRowid(pTable) ){
    /* For WITHOUT ROWID tables, ensure that all PRIMARY KEY columns are
    ** either in the idxCols mask or in the extraCols mask */
    for(i=0; i<pTable->nCol; i++){
      if( (pTable->aCol[i].colFlags & COLFLAG_PRIMKEY)==0 ) continue;
      if( i>=BMS-1 ){
        extraCols |= MASKBIT(BMS-1);
        break;
      }
      if( idxCols & MASKBIT(i) ) continue;
      extraCols |= MASKBIT(i);
    }
  }
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+HasRowid(pTable),
                                    0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.x.leftColumn;
        pColl = sqlite3ExprCompareCollSeq(pParse, pX);
        assert( pColl!=0 || pParse->nErr>0 ); /* TH3 collate01.800 */
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
        if( ALWAYS(pX->pLeft!=0)
         && sqlite3ExprAffinity(pX->pLeft)!=SQLITE_AFF_TEXT
        ){
          /* TUNING: only use a Bloom filter on an automatic index
          ** if one or more key columns has the ability to hold numeric
          ** values, since strings all have the same hash in the Bloom
          ** filter implementation and hence a Bloom filter on a text column
          ** is not usually helpful. */
          useBloomFilter = 1;
        }
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  if( HasRowid(pTable) ){
    pIdx->aiColumn[n] = XN_ROWID;
    pIdx->azColl[n] = sqlite3StrBINARY;
  }

  /* Create the automatic index */
  explainAutomaticIndex(pParse, pIdx, pPartial!=0, &addrExp);
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));
  if( OptimizationEnabled(pParse->db, SQLITE_BloomFilter) && useBloomFilter ){
    sqlite3WhereExplainBloomFilter(pParse, pWC->pWInfo, pLevel);
    pLevel->regFilter = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Blob, 10000, pLevel->regFilter);
  }

  /* Fill the automatic index with content */
  assert( pSrc == &pWC->pWInfo->pTabList->a[pLevel->iFrom] );
  if( pSrc->fg.viaCoroutine ){
    int regYield;
    Subquery *pSubq;
    assert( pSrc->fg.isSubquery );
    pSubq = pSrc->u4.pSubq;
    assert( pSubq!=0 );
    regYield = pSubq->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pSubq->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pSrc->pSTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(pParse);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  if( pLevel->regFilter ){
    sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0,
                         regBase, pLoop->u.btree.nEq);
  }
  sqlite3VdbeScanStatusCounters(v, addrExp, addrExp, sqlite3VdbeCurrentAddr(v));
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pSrc->fg.viaCoroutine ){
    assert( pSrc->fg.isSubquery && pSrc->u4.pSubq!=0 );
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    assert( pLevel->iIdxCur>0 );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pSrc->u4.pSubq->regResult, pLevel->iIdxCur);
    sqlite3VdbeGoto(v, addrTop);
    pSrc->fg.viaCoroutine = 0;
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
    sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  }
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);

  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);
  sqlite3VdbeScanStatusRange(v, addrExp, addrExp, -1);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}